

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Loop::IsLCSSA(Loop *this)

{
  IRContext *pIVar1;
  Instruction *def;
  bool bVar2;
  CFG *this_00;
  DefUseManager *this_01;
  __node_base *p_Var3;
  BasicBlock *pBVar4;
  Instruction *insn;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  
  this_00 = IRContext::cfg(this->context_);
  this_01 = IRContext::get_def_use_mgr(this->context_);
  exit_blocks._M_h._M_buckets = &exit_blocks._M_h._M_single_bucket;
  exit_blocks._M_h._M_bucket_count = 1;
  exit_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exit_blocks._M_h._M_element_count = 0;
  exit_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  exit_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  exit_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GetExitBlocks(this,&exit_blocks);
  pIVar1 = this->context_;
  p_Var3 = &(this->loop_basic_blocks_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    pBVar4 = CFG::block(this_00,(uint32_t)*(size_type *)(p_Var3 + 1));
    def = &(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (def = *(Instruction **)
                  ((long)&def->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          def != &(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      local_88._8_8_ = 0;
      local_88._M_unused._M_object = operator_new(0x18);
      *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        **)local_88._M_unused._0_8_ = &exit_blocks;
      *(IRContext **)((long)local_88._M_unused._0_8_ + 8) = pIVar1;
      *(Loop **)((long)local_88._M_unused._0_8_ + 0x10) = this;
      local_70 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:440:15)>
                 ::_M_invoke;
      local_78 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:440:15)>
                 ::_M_manager;
      bVar2 = analysis::DefUseManager::WhileEachUser
                        (this_01,def,(function<bool_(spvtools::opt::Instruction_*)> *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (!bVar2) goto LAB_0020e788;
    }
  }
LAB_0020e788:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&exit_blocks._M_h);
  return p_Var3 == (__node_base *)0x0;
}

Assistant:

bool Loop::IsLCSSA() const {
  CFG* cfg = context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  std::unordered_set<uint32_t> exit_blocks;
  GetExitBlocks(&exit_blocks);

  // Declare ir_context so we can capture context_ in the below lambda
  IRContext* ir_context = context_;

  for (uint32_t bb_id : GetBlocks()) {
    for (Instruction& insn : *cfg->block(bb_id)) {
      // All uses must be either:
      //  - In the loop;
      //  - In an exit block and in a phi instruction.
      if (!def_use_mgr->WhileEachUser(
              &insn,
              [&exit_blocks, ir_context, this](Instruction* use) -> bool {
                BasicBlock* parent = ir_context->get_instr_block(use);
                assert(parent && "Invalid analysis");
                if (IsInsideLoop(parent)) return true;
                if (use->opcode() != spv::Op::OpPhi) return false;
                return exit_blocks.count(parent->id());
              }))
        return false;
    }
  }
  return true;
}